

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

ContiguousMemoryRange __thiscall
protozero::StaticBufferDelegate::GetNewBuffer(StaticBufferDelegate *this)

{
  uint __errnum;
  code *pcVar1;
  char *fname;
  uint *puVar2;
  char *pcVar3;
  
  if (this->get_new_buffer_called_once_ != true) {
    this->get_new_buffer_called_once_ = true;
    return this->range_;
  }
  fname = perfetto::base::Basename
                    (
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                    );
  puVar2 = (uint *)__errno_location();
  __errnum = *puVar2;
  pcVar3 = strerror(__errnum);
  perfetto::base::LogMessage
            (kLogError,fname,0x2a07,"Static buffer too small (errno: %d, %s)",(ulong)__errnum,pcVar3
            );
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

ContiguousMemoryRange StaticBufferDelegate::GetNewBuffer() {
  if (get_new_buffer_called_once_) {
    // This is the 2nd time GetNewBuffer is called. The estimate is wrong. We
    // shouldn't try to grow the buffer after the initial call.
    PERFETTO_FATAL("Static buffer too small");
  }
  get_new_buffer_called_once_ = true;
  return range_;
}